

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_0::ShaderTypeCase::test(ShaderTypeCase *this)

{
  GLuint shader_00;
  int local_1c;
  GLuint shader;
  int ndx;
  GLenum shaderTypes [2];
  ShaderTypeCase *this_local;
  
  shaderTypes = (GLenum  [2])this;
  _shader = 0x8b3000008b31;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    shader_00 = glu::CallLogWrapper::glCreateShader
                          (&(this->super_ApiCase).super_CallLogWrapper,(&shader)[local_1c]);
    verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                      &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b4f,
                      (&shader)[local_1c]);
    glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum shaderTypes[] = {GL_VERTEX_SHADER, GL_FRAGMENT_SHADER};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
		{
			const GLuint shader = glCreateShader(shaderTypes[ndx]);
			verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_TYPE, shaderTypes[ndx]);
			glDeleteShader(shader);
		}
	}